

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O1

void printError(uint32_t lineno,string *error)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,g_Options.inputFile._M_dataplus._M_p,
                      g_Options.inputFile._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(error->_M_dataplus)._M_p,error->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void printError(uint32_t lineno, const string& error)
{
	cerr << g_Options.inputFile << "(" << lineno << "): " << error << endl;
}